

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O3

void * raviX_ptrlist_iter_next(PtrListIterator *self)

{
  void *pvVar1;
  PtrList *pPVar2;
  int iVar3;
  
  if (self->__head == (PtrList *)0x0) {
    return (void *)0x0;
  }
  iVar3 = self->__nr + 1;
  self->__nr = iVar3;
  pPVar2 = self->__list;
  do {
    if (iVar3 < (char)*(uint *)pPVar2) {
      pvVar1 = pPVar2->list_[iVar3];
      if ((*(uint *)pPVar2 & 0xffff) < 0x100) {
        return pvVar1;
      }
      if (pvVar1 != (void *)0x0) {
        return pvVar1;
      }
      iVar3 = iVar3 + 1;
    }
    else {
      pPVar2 = pPVar2->next_;
      if (pPVar2 == self->__head) {
        return (void *)0x0;
      }
      self->__list = pPVar2;
      iVar3 = 0;
    }
    self->__nr = iVar3;
  } while( true );
}

Assistant:

void *raviX_ptrlist_iter_next(PtrListIterator *self)
{
	if (self->__head == NULL)
		return NULL;
	self->__nr++;
Lretry:
	if (self->__nr < self->__list->nr_) {
		void *ptr = self->__list->list_[self->__nr];
		if (self->__list->rm_ && !ptr) {
			self->__nr++;
			goto Lretry;
		}
		return ptr;
	} else if (self->__list->next_ != self->__head) {
		self->__list = self->__list->next_;
		self->__nr = 0;
		goto Lretry;
	}
	return NULL;
}